

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O3

string * get_process_owner(string *__return_storage_ptr__,string *pid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__nptr;
  char cVar4;
  long *plVar5;
  long lVar6;
  int *piVar7;
  passwd *ppVar8;
  undefined8 uVar9;
  ulong *puVar10;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  long local_238 [65];
  
  std::ifstream::ifstream(local_238);
  std::operator+(&local_290,"/proc/",pid);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  paVar1 = &local_270.field_2;
  puVar10 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270.field_2._8_8_ = plVar5[3];
    local_270._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_270._M_string_length = plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ifstream::open((string *)local_238,(_Ios_Openmode)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  paVar2 = &local_290.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  local_270._M_string_length = 0;
  local_270.field_2._M_allocated_capacity =
       local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_270._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    lVar6 = std::__cxx11::string::find((char *)&local_270,0x11d285,0);
    if (lVar6 != -1) break;
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(string *)local_238)
    ;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_270,cVar4);
  }
  std::ifstream::close();
  local_290._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"\\s+","");
  split(&local_250,&local_270,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  __nptr = local_250.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
  piVar7 = __errno_location();
  iVar3 = *piVar7;
  *piVar7 = 0;
  lVar6 = strtol(__nptr,(char **)&local_290,10);
  if (local_290._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)(__uid_t)lVar6 == lVar6) && (*piVar7 != 0x22)) {
    if (*piVar7 == 0) {
      *piVar7 = iVar3;
    }
    ppVar8 = getpwuid((__uid_t)lVar6);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,ppVar8->pw_name,(allocator *)&local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return __return_storage_ptr__;
  }
  uVar9 = std::__throw_out_of_range("stoi");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar9);
}

Assistant:

std::string get_process_owner(const std::string &pid) {
    std::ifstream fin;
    fin.open("/proc/" + pid + "/status");
    std::string line;
    while (line.find("Uid") == std::string::npos) {
        getline(fin, line);
    }
    fin.close();

    std::vector<std::string> info = split(line, "\\s+");
    return getpwuid(stoi(info[2]))->pw_name;
}